

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,decimal_fp<float> *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  significand_type sVar1;
  ulong uVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  int iVar4;
  long lVar5;
  size_t size;
  uint uVar6;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_75 [5];
  decimal_fp<float> local_70;
  sign_t local_68;
  int local_64;
  uint local_60;
  undefined1 local_5c [4];
  anon_class_56_7_a2a26a24 local_58;
  ulong uVar7;
  
  local_60 = fp->significand;
  uVar6 = 0x1f;
  if ((local_60 | 1) != 0) {
    for (; (local_60 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  local_64 = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar6 * 2) -
             (uint)(local_60 <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar6 * 2) * 4));
  local_70.exponent = fspecs._4_4_;
  local_68 = (uint)local_70.exponent >> 8 & 0xff;
  local_75[0] = decimal_point;
  local_70 = (decimal_fp<float>)fspecs;
  if (local_64 < 0) goto LAB_00207e42;
  uVar6 = (local_64 + 1) - (uint)(local_68 == none);
  uVar7 = (ulong)uVar6;
  iVar4 = fp->exponent;
  sVar1 = iVar4 + local_64;
  local_70.significand = fspecs.precision;
  if (fspecs._4_1_ != '\x01') {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar10 = 0x10;
      if (0 < (int)local_70.significand) {
        uVar10 = local_70.significand;
      }
      if (((int)sVar1 < -3) || ((int)uVar10 < (int)sVar1)) goto LAB_00207c0e;
    }
    local_5c = (undefined1  [4])sVar1;
    if (iVar4 < 0) {
      if (0 < (int)sVar1) {
        local_75._1_4_ = local_70.significand - local_64 & (local_70.exponent << 0xb) >> 0x1f;
        local_58.decimal_point = local_75 + 1;
        uVar9 = (ulong)(uint)local_75._1_4_;
        if ((int)local_75._1_4_ < 1) {
          uVar9 = 0;
        }
        size = uVar9 + uVar7 + 1;
        local_58.sign = &local_68;
        local_58.significand = &local_60;
        local_58.significand_size = &local_64;
        local_58.fp = (decimal_fp<float> *)local_5c;
        local_58.fspecs = (float_specs *)local_75;
        bVar3 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_3_&>
                          (out,specs,size,size,(anon_class_48_6_48d028d1 *)&local_58);
        return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
      }
      uVar6 = -sVar1;
      local_75._1_4_ = uVar6;
      if (SBORROW4(local_70.significand,uVar6) != (int)(local_70.significand + sVar1) < 0) {
        local_75._1_4_ = local_70.significand;
      }
      if ((int)local_70.significand < 0) {
        local_75._1_4_ = uVar6;
      }
      if (local_64 != 0) {
        local_75._1_4_ = uVar6;
      }
      if (-1 < (int)local_75._1_4_) {
        local_58.sign = &local_68;
        local_58.significand = (significand_type *)(local_75 + 1);
        local_58.significand_size = &local_64;
        local_58.fp = &local_70;
        local_58.fspecs = (float_specs *)local_75;
        local_58.decimal_point = (char *)&local_60;
        uVar9 = (ulong)specs->width;
        if (-1 < (long)uVar9) {
          uVar2 = (uint)local_75._1_4_ + uVar7 + 2;
          uVar7 = 0;
          if (uVar2 <= uVar9) {
            uVar7 = uVar9 - uVar2;
          }
          uVar9 = uVar7 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                     (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
          bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                            (out,uVar9,&specs->fill);
          bVar3.container =
               (buffer<char> *)
               write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
               ::anon_class_48_6_9afe1116::operator()
                         ((anon_class_48_6_9afe1116 *)&local_58,bVar3.container);
          goto LAB_00207cf3;
        }
      }
    }
    else {
      uVar9 = (ulong)(iVar4 + uVar6);
      local_75._1_4_ = local_70.significand - sVar1;
      if (((uint)local_70.exponent >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_75._1_4_ < 1)) {
          local_75._1_4_ = 1;
        }
        if (0 < (long)(int)local_75._1_4_) {
          uVar9 = uVar9 + (long)(int)local_75._1_4_;
        }
      }
      local_58.sign = &local_68;
      local_58.significand = &local_60;
      local_58.significand_size = &local_64;
      local_58.fspecs = (float_specs *)&local_70;
      local_58.decimal_point = local_75;
      local_58.num_zeros = (int *)(local_75 + 1);
      uVar2 = (ulong)specs->width;
      local_58.fp = fp;
      if (-1 < (long)uVar2) {
        uVar7 = 0;
        if (uVar9 <= uVar2) {
          uVar7 = uVar2 - uVar9;
        }
        uVar9 = uVar7 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                          (out,uVar9,&specs->fill);
        bVar3.container =
             (buffer<char> *)
             write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
             ::anon_class_56_7_a2a26a24::operator()(&local_58,bVar3.container);
        goto LAB_00207cf3;
      }
    }
LAB_00207e42:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
LAB_00207c0e:
  iVar4 = iVar4 + local_64 + -1;
  if (((uint)local_70.exponent >> 0x14 & 1) == 0) {
    iVar8 = 0;
    if (local_64 == 1) {
      local_75[0] = '\0';
      iVar8 = 0;
    }
  }
  else {
    iVar8 = 0;
    if (0 < (int)(local_70.significand - local_64)) {
      iVar8 = local_70.significand - local_64;
    }
    uVar7 = (ulong)(uVar6 + iVar8);
  }
  local_58.sign = (sign_t *)(CONCAT44(local_60,(uint)local_70.exponent >> 8) & 0xffffffff000000ff);
  local_58.significand._0_5_ = CONCAT14(local_75[0],local_64);
  local_58.significand_size =
       (int *)(CONCAT35(local_58.significand_size._5_3_,
                        CONCAT14((((uint)local_70.exponent >> 0x10 & 1) == 0) << 5,iVar8)) |
              0x4500000000);
  local_58.fp = (decimal_fp<float> *)CONCAT44(local_58.fp._4_4_,iVar4);
  uVar9 = (ulong)specs->width;
  if ((long)uVar9 < 1) {
    bVar3 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
            ::anon_class_28_7_94dcc806::operator()
                      ((anon_class_28_7_94dcc806 *)&local_58,out.container);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
  }
  if ((int)sVar1 < 1) {
    iVar4 = 1 - sVar1;
  }
  lVar5 = 2;
  if (99 < iVar4) {
    lVar5 = (ulong)(999 < iVar4) + 3;
  }
  uVar2 = uVar7 + (3 - (ulong)(local_75[0] == '\0')) + lVar5;
  uVar7 = 0;
  if (uVar2 <= uVar9) {
    uVar7 = uVar9 - uVar2;
  }
  uVar9 = uVar7 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                             (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (out,uVar9,&specs->fill);
  bVar3 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
          ::anon_class_28_7_94dcc806::operator()
                    ((anon_class_28_7_94dcc806 *)&local_58,bVar3.container);
LAB_00207cf3:
  bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (bVar3,uVar7 - uVar9,&specs->fill);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}